

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O3

void __thiscall
baryonyx::itm::
solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
::solver_inequalities_01coeff
          (solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  pointer pmVar1;
  pointer pfVar2;
  pointer pfVar3;
  FILE *__stream;
  byte bVar4;
  bool bVar5;
  ulong uVar6;
  longdouble *plVar7;
  rc_data *prVar8;
  bound_factor *__s;
  undefined8 extraout_RAX;
  long lVar9;
  int iVar10;
  uint uVar11;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *pvVar12;
  pointer pfVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  string_view name;
  
  name._M_str = "solver_inequalities_01coeff";
  name._M_len = 0x1b;
  pvVar12 = csts;
  debug_logger<true>::debug_logger(&this->super_debug_logger<true>,name);
  this->rng = rng_;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(&this->ap,csts,m_,n_);
  uVar14 = (ulong)(this->ap).m_rows_values.m_length << 4;
  plVar7 = (longdouble *)operator_new__(uVar14);
  memset(plVar7,0,uVar14);
  (this->P)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
  super__Head_base<0UL,_long_double_*,_false>._M_head_impl = plVar7;
  pmVar1 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)(csts->
                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar1;
  uVar14 = (long)*(pointer *)
                  ((long)&(pmVar1->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl + 8) -
           *(long *)&(pmVar1->elements).
                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ._M_impl >> 3;
  if (lVar9 != 0x28) {
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar20 = vpbroadcastq_avx512f(ZEXT816(0x28));
    auVar21 = vpbroadcastq_avx512f(ZEXT816(8));
    auVar22 = vpbroadcastq_avx512f();
    uVar14 = 0;
    auVar23 = vpbroadcastq_avx512f();
    do {
      auVar24 = vpbroadcastq_avx512f();
      auVar25 = vmovdqa64_avx512f(auVar22);
      vpmullq_avx512dq(auVar18,auVar20);
      uVar14 = uVar14 + 8;
      auVar18 = vpaddq_avx512f(auVar18,auVar21);
      auVar22 = vporq_avx512f(auVar24,auVar19);
      uVar6 = vpcmpuq_avx512f(auVar22,auVar23,2);
      auVar22 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)((long)&(pmVar1->elements).
                                                                                                      
                                                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                                  ._M_impl + 8U) + (long)pvVar12));
      bVar4 = (byte)uVar6;
      auVar24._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar22._8_8_;
      auVar24._0_8_ = (ulong)(bVar4 & 1) * auVar22._0_8_;
      auVar24._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar22._16_8_;
      auVar24._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar22._24_8_;
      auVar24._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar22._32_8_;
      auVar24._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar22._40_8_;
      auVar24._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar22._48_8_;
      auVar24._56_8_ = (uVar6 >> 7) * auVar22._56_8_;
      auVar22 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)&(pvVar12->
                                            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                            )._M_impl.super__Vector_impl_data +
                                    (long)&(pmVar1->elements).
                                           super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                           ._M_impl));
      auVar26._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar22._8_8_;
      auVar26._0_8_ = (ulong)(bVar4 & 1) * auVar22._0_8_;
      auVar26._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar22._16_8_;
      auVar26._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar22._24_8_;
      auVar26._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar22._32_8_;
      auVar26._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar22._40_8_;
      auVar26._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar22._48_8_;
      auVar26._56_8_ = (uVar6 >> 7) * auVar22._56_8_;
      auVar22 = vpsubq_avx512f(auVar24,auVar26);
      auVar22 = vpsraq_avx512f(auVar22,3);
      auVar22 = vpmaxuq_avx512f(auVar25,auVar22);
    } while (((lVar9 >> 3) * -0x3333333333333333 + 6U & 0xfffffffffffffff8) != uVar14);
    auVar18 = vmovdqa64_avx512f(auVar22);
    auVar19._0_8_ = (ulong)(bVar4 & 1) * auVar18._0_8_ | (ulong)!(bool)(bVar4 & 1) * auVar25._0_8_;
    bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
    auVar19._8_8_ = (ulong)bVar5 * auVar18._8_8_ | (ulong)!bVar5 * auVar25._8_8_;
    bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
    auVar19._16_8_ = (ulong)bVar5 * auVar18._16_8_ | (ulong)!bVar5 * auVar25._16_8_;
    bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
    auVar19._24_8_ = (ulong)bVar5 * auVar18._24_8_ | (ulong)!bVar5 * auVar25._24_8_;
    bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
    auVar19._32_8_ = (ulong)bVar5 * auVar18._32_8_ | (ulong)!bVar5 * auVar25._32_8_;
    bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
    auVar19._40_8_ = (ulong)bVar5 * auVar18._40_8_ | (ulong)!bVar5 * auVar25._40_8_;
    bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
    auVar19._48_8_ = (ulong)bVar5 * auVar18._48_8_ | (ulong)!bVar5 * auVar25._48_8_;
    auVar19._56_8_ = (uVar6 >> 7) * auVar18._56_8_ | (ulong)!SUB81(uVar6 >> 7,0) * auVar25._56_8_;
    auVar17 = vextracti64x4_avx512f(auVar19,1);
    auVar18 = vpmaxuq_avx512f(auVar19,ZEXT3264(auVar17));
    auVar15 = vpmaxuq_avx512vl(auVar18._0_16_,auVar18._16_16_);
    auVar16 = vpshufd_avx(auVar15,0xee);
    auVar16 = vpmaxuq_avx512vl(auVar15,auVar16);
    uVar14 = auVar16._0_8_;
  }
  uVar14 = -(ulong)(uVar14 >> 0x3b != 0) | uVar14 << 5;
  prVar8 = (rc_data *)operator_new__(uVar14);
  memset(prVar8,0,uVar14);
  (this->R)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
  ._M_head_impl = prVar8;
  uVar14 = (long)m_ * 8;
  if (m_ < 0) {
    uVar14 = 0xffffffffffffffff;
  }
  __s = (bound_factor *)operator_new__(uVar14);
  memset(__s,0,uVar14);
  uVar14 = (long)m_ << 4;
  (this->b)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor_*,_false>
  ._M_head_impl = __s;
  if (m_ < 0) {
    uVar14 = 0xffffffffffffffff;
  }
  plVar7 = (longdouble *)operator_new__(uVar14);
  memset(plVar7,0,uVar14);
  (this->pi)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
  super__Head_base<0UL,_long_double_*,_false>._M_head_impl = plVar7;
  this->c = c_;
  this->m = m_;
  this->n = n_;
  if (m_ != 0) {
    pmVar1 = (csts->
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar14 = 0;
    do {
      pfVar3 = *(pointer *)
                ((long)&pmVar1[uVar14].elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      pfVar2 = *(pointer *)
                &pmVar1[uVar14].elements.
                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                 ._M_impl;
      for (pfVar13 = pfVar2; pfVar13 != pfVar3; pfVar13 = pfVar13 + 1) {
        if (pfVar13->factor != 1) {
          itm::solver_inequalities_01coeff();
          goto LAB_0040e517;
        }
      }
      uVar11 = pmVar1[uVar14].min;
      if (uVar11 == pmVar1[uVar14].max) {
        __s[uVar14].min = uVar11;
        __s[uVar14].max = uVar11;
      }
      else {
        uVar11 = ~((int)uVar11 >> 0x1f) & uVar11;
        __s[uVar14].min = uVar11;
        iVar10 = (int)((ulong)((long)pfVar3 - (long)pfVar2) >> 3);
        if (pmVar1[uVar14].max < iVar10) {
          iVar10 = pmVar1[uVar14].max;
        }
        __s[uVar14].max = iVar10;
        if (iVar10 < (int)uVar11) {
LAB_0040e517:
          itm::solver_inequalities_01coeff();
          operator_delete__(__s);
          (this->b)._M_t.
          super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor[]>_>
          .
          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::bound_factor_*,_false>
          ._M_head_impl = (bound_factor *)0x0;
          prVar8 = (this->R)._M_t.
                   super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
                   .
                   super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
                   ._M_head_impl;
          if (prVar8 != (rc_data *)0x0) {
            operator_delete__(prVar8);
          }
          (this->R)._M_t.
          super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data[]>_>
          .
          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>::rc_data_*,_false>
          ._M_head_impl = (rc_data *)0x0;
          plVar7 = (this->P)._M_t.
                   super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                   super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                   super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
          if (plVar7 != (longdouble *)0x0) {
            operator_delete__(plVar7);
          }
          (this->P)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>.
          _M_t.super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
          super__Head_base<0UL,_long_double_*,_false>._M_head_impl = (longdouble *)0x0;
          sparse_matrix<int>::~sparse_matrix(&this->ap);
          __stream = (FILE *)(this->super_debug_logger<true>).ofs;
          if (__stream != (FILE *)0x0) {
            fclose(__stream);
          }
          _Unwind_Resume(extraout_RAX);
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != (uint)m_);
  }
  return;
}

Assistant:

solver_inequalities_01coeff(random_engine& rng_,
                                int m_,
                                int n_,
                                const cost_type& c_,
                                const std::vector<merged_constraint>& csts)
      : logger("solver_inequalities_01coeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        for (int i = 0; i != m; ++i) {
#if !defined(BARYONYX_FULL_OPTIMIZATION)
            // mscv 15.9.6 fail to build this line:
            // for ([[maybe_unused]] const auto& cst : csts[i].elements)
            //    bx_ensures(cst.factor == 1);
            for (const auto& cst : csts[i].elements)
                bx_ensures(cst.factor == 1);
#endif

            if (csts[i].min == csts[i].max) {
                b[i].min = csts[i].min;
                b[i].max = csts[i].max;
            } else {
                b[i].min = std::max(0, csts[i].min);
                b[i].max = std::min(length(csts[i].elements), csts[i].max);
            }

            bx_ensures(b[i].min <= b[i].max);
        }
    }